

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void SetOptimizationLookBehind(CodeGenGenericContext *ctx,bool allow)

{
  bool allow_local;
  CodeGenGenericContext *ctx_local;
  
  ctx->x86LookBehind = allow;
  if (!allow) {
    CodeGenGenericContext::KillUnreadRegisters(ctx);
    ctx->lastInvalidate = (uint)(((long)ctx->x86Op - (long)ctx->x86Base) / 0x50);
    CodeGenGenericContext::InvalidateState(ctx);
    ctx->genRegUpdate[5] = 0;
  }
  return;
}

Assistant:

void SetOptimizationLookBehind(CodeGenGenericContext &ctx, bool allow)
{
	ctx.x86LookBehind = allow;

#ifdef NULLC_OPTIMIZE_X86
	if(!allow)
	{
		ctx.KillUnreadRegisters();

		ctx.lastInvalidate = unsigned(ctx.x86Op - ctx.x86Base);
		ctx.InvalidateState();

		ctx.genRegUpdate[rESP] = 0;
	}
#endif
}